

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bool.cpp
# Opt level: O2

AggregateFunction * duckdb::BoolAndFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  FunctionNullHandling in_R8B;
  LogicalType local_40 [24];
  
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd8,BOOLEAN);
  duckdb::LogicalType::LogicalType(local_40,BOOLEAN);
  AggregateFunction::
  UnaryAggregate<duckdb::BoolState,bool,bool,duckdb::BoolAndFunFunction,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffd8,local_40,(LogicalType *)0x0,in_R8B
            );
  duckdb::LogicalType::~LogicalType(local_40);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd8);
  in_RDI->order_dependent = NOT_ORDER_DEPENDENT;
  in_RDI->distinct_dependent = NOT_DISTINCT_DEPENDENT;
  return in_RDI;
}

Assistant:

AggregateFunction BoolAndFun::GetFunction() {
	auto fun = AggregateFunction::UnaryAggregate<BoolState, bool, bool, BoolAndFunFunction>(
	    LogicalType(LogicalTypeId::BOOLEAN), LogicalType::BOOLEAN);
	fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
	fun.distinct_dependent = AggregateDistinctDependent::NOT_DISTINCT_DEPENDENT;
	return fun;
}